

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool __thiscall
bssl::ssl_is_alpn_protocol_allowed(bssl *this,SSL_HANDSHAKE *hs,Span<const_unsigned_char> protocol)

{
  Span<const_unsigned_char> protocol_00;
  bool bVar1;
  pointer psVar2;
  Span<const_unsigned_char> local_38;
  bssl *local_28;
  SSL_HANDSHAKE *hs_local;
  Span<const_unsigned_char> protocol_local;
  
  protocol_local.data_ = protocol.data_;
  local_28 = this;
  hs_local = hs;
  bVar1 = Array<unsigned_char>::empty((Array<unsigned_char> *)(*(long *)(this + 8) + 0x98));
  if (bVar1) {
    protocol_local.size_._7_1_ = false;
  }
  else {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                        (*(long *)local_28 + 0x68));
    if ((*(ushort *)&psVar2->field_0x288 >> 7 & 1) == 0) {
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_38,
                 (Array<unsigned_char> *)(*(long *)(local_28 + 8) + 0x98));
      protocol_00.size_ = (size_t)protocol_local.data_;
      protocol_00.data_ = (uchar *)hs_local;
      protocol_local.size_._7_1_ = ssl_alpn_list_contains_protocol(local_38,protocol_00);
    }
    else {
      protocol_local.size_._7_1_ = true;
    }
  }
  return protocol_local.size_._7_1_;
}

Assistant:

bool ssl_is_alpn_protocol_allowed(const SSL_HANDSHAKE *hs,
                                  Span<const uint8_t> protocol) {
  if (hs->config->alpn_client_proto_list.empty()) {
    return false;
  }

  if (hs->ssl->ctx->allow_unknown_alpn_protos) {
    return true;
  }

  // Check that the protocol name is one of the ones we advertised.
  return ssl_alpn_list_contains_protocol(hs->config->alpn_client_proto_list,
                                         protocol);
}